

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

boundaries *
nlohmann::detail::dtoa_impl::compute_boundaries<double>
          (boundaries *__return_storage_ptr__,double value)

{
  uint uVar1;
  long lVar2;
  diyfp *pdVar3;
  diyfp *pdVar4;
  ulong uVar5;
  diyfp *this;
  diyfp *pdVar6;
  diyfp *this_00;
  diyfp dVar7;
  diyfp dVar8;
  diyfp dVar9;
  uint local_44;
  diyfp local_40;
  
  if (0x7fefffffffffffff < (ulong)ABS(value)) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x2155,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  if (value <= 0.0) {
    __assert_fail("value > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x2156,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  this_00 = (diyfp *)0x10000000000000;
  pdVar3 = (diyfp *)((ulong)value & 0xfffffffffffff);
  if ((ulong)value >> 0x34 == 0) {
    this = (diyfp *)((long)value * 2 + 1);
    lVar2 = (long)value * 2;
    local_44 = 0xfffffbce;
    uVar5 = 0xfffffbcd;
    pdVar6 = pdVar3;
  }
  else {
    pdVar6 = (diyfp *)((ulong)pdVar3 | 0x10000000000000);
    uVar1 = (uint)((ulong)value >> 0x20);
    local_44 = (uVar1 >> 0x14) - 0x433;
    pdVar4 = (diyfp *)CONCAT71((int7)((ulong)pdVar3 >> 8),pdVar3 != (diyfp *)0x0);
    this = (diyfp *)((long)pdVar6 * 2 + 1);
    uVar5 = (ulong)((uVar1 >> 0x14) - 0x434);
    if ((ulong)value >> 0x35 != 0 && pdVar3 == (diyfp *)0x0) {
      local_40.e = (uVar1 >> 0x14) - 0x435;
      local_40.f = 0x3fffffffffffff;
      goto LAB_0019befb;
    }
    lVar2 = (long)pdVar6 * 2;
  }
  local_40.f = lVar2 - 1;
  local_40.e = (int)uVar5;
  pdVar4 = pdVar6;
  this_00 = pdVar6;
LAB_0019befb:
  dVar7._8_8_ = pdVar4;
  dVar7.f = uVar5;
  dVar7 = diyfp::normalize(this,dVar7);
  dVar8 = diyfp::normalize_to(&local_40,dVar7.e);
  dVar9._8_8_ = dVar8._8_8_;
  dVar9.f = (ulong)local_44;
  dVar9 = diyfp::normalize(this_00,dVar9);
  (__return_storage_ptr__->w).f = dVar9.f;
  (__return_storage_ptr__->w).e = dVar9.e;
  (__return_storage_ptr__->minus).f = dVar8.f;
  (__return_storage_ptr__->minus).e = dVar8.e;
  (__return_storage_ptr__->plus).f = dVar7.f;
  (__return_storage_ptr__->plus).e = dVar7.e;
  return __return_storage_ptr__;
}

Assistant:

boundaries compute_boundaries(FloatType value) {
	assert(std::isfinite(value));
	assert(value > 0);

	// Convert the IEEE representation into a diyfp.
	//
	// If v is denormal:
	//      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
	// If v is normalized:
	//      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

	static_assert(std::numeric_limits<FloatType>::is_iec559,
				  "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

	constexpr int kPrecision = std::numeric_limits<FloatType>::digits;  // = p (includes the hidden bit)
	constexpr int kBias = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
	constexpr int kMinExp = 1 - kBias;
	constexpr uint64_t kHiddenBit = uint64_t{1} << (kPrecision - 1);  // = 2^(p-1)

	using bits_type = typename std::conditional<kPrecision == 24, uint32_t, uint64_t>::type;

	const uint64_t bits = reinterpret_bits<bits_type>(value);
	const uint64_t E = bits >> (kPrecision - 1);
	const uint64_t F = bits & (kHiddenBit - 1);

	const bool is_denormal = (E == 0);
	const diyfp v = is_denormal ? diyfp(F, kMinExp) : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

	// Compute the boundaries m- and m+ of the floating-point value
	// v = f * 2^e.
	//
	// Determine v- and v+, the floating-point predecessor and successor if v,
	// respectively.
	//
	//      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
	//         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
	//
	//      v+ = v + 2^e
	//
	// Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
	// between m- and m+ round to v, regardless of how the input rounding
	// algorithm breaks ties.
	//
	//      ---+-------------+-------------+-------------+-------------+---  (A)
	//         v-            m-            v             m+            v+
	//
	//      -----------------+------+------+-------------+-------------+---  (B)
	//                       v-     m-     v             m+            v+

	const bool lower_boundary_is_closer = (F == 0 and E > 1);
	const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
	const diyfp m_minus = lower_boundary_is_closer ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
												   : diyfp(2 * v.f - 1, v.e - 1);  // (A)

	// Determine the normalized w+ = m+.
	const diyfp w_plus = diyfp::normalize(m_plus);

	// Determine w- = m- such that e_(w-) = e_(w+).
	const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

	return {diyfp::normalize(v), w_minus, w_plus};
}